

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulator.c
# Opt level: O1

_Bool al_triangulate_polygon
                (float *vertices,size_t vertex_stride,int *vertex_counts,
                _func_void_int_int_int_void_ptr *emit_triangle,void *userdata)

{
  int iVar1;
  void *pvVar2;
  _Bool _Var3;
  char cVar4;
  int iVar5;
  int *__ptr;
  ulong uVar6;
  _AL_LIST *vertices_00;
  _AL_LIST *reflex;
  _AL_LIST *ear;
  long lVar7;
  int *piVar8;
  float *pfVar9;
  float *p1;
  float *pfVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  _AL_LIST_ITEM *p_Var13;
  _AL_LIST_ITEM *p_Var14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  size_t __size;
  long lVar18;
  long lVar19;
  _AL_LIST_ITEM *p_Var20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float t1;
  float t0;
  float v1 [2];
  float intersection [2];
  _AL_LIST_ITEM *local_d0;
  _AL_LIST_ITEM *local_a0;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  void *local_50;
  _func_void_int_int_int_void_ptr *local_48;
  float local_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  uVar16 = 0xffffffffffffffff;
  lVar19 = -0x20;
  lVar18 = 4;
  __size = 0xfffffffffffffffc;
  do {
    lVar19 = lVar19 + 0x20;
    lVar18 = lVar18 + -2;
    __size = __size + 4;
    lVar21 = uVar16 + 1;
    uVar16 = uVar16 + 1;
  } while (0 < vertex_counts[lVar21]);
  local_48 = emit_triangle;
  __ptr = (int *)malloc(__size);
  if (__ptr == (int *)0x0) {
    return false;
  }
  lVar21 = 0;
  if (uVar16 != 0) {
    uVar6 = 0;
    do {
      lVar21 = (long)(int)lVar21 + (long)vertex_counts[uVar6];
      __ptr[uVar6] = (int)lVar21;
      uVar6 = uVar6 + 1;
    } while (uVar16 != uVar6);
  }
  lVar21 = lVar21 - lVar18;
  local_50 = userdata;
  vertices_00 = (_AL_LIST *)_al_list_create_static(lVar21);
  reflex = (_AL_LIST *)_al_list_create_static(lVar21);
  ear = (_AL_LIST *)_al_list_create_static(lVar21);
  if (1 < uVar16) {
    lVar18 = _al_list_create_static(uVar16);
    lVar19 = al_malloc_with_context
                       (lVar19,0x112,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/primitives/triangulator.c"
                        ,"poly_create_split_list");
    if (lVar19 != 0 && lVar18 != 0) {
      _al_list_set_dtor(lVar18,poly_split_list_dtor);
      _al_list_set_user_data(lVar18,lVar19);
      uVar6 = 1;
      iVar5 = *__ptr;
      do {
        lVar15 = uVar6 * 0x20;
        lVar21 = lVar19 + lVar15;
        *(int *)(lVar19 + lVar15) = iVar5;
        iVar1 = __ptr[uVar6];
        fVar28 = -3.4028235e+38;
        *(long *)(lVar19 + 8 + lVar15) = (long)(iVar1 - iVar5);
        *(undefined4 *)(lVar19 + 0x18 + lVar15) = 0xffffffff;
        if (iVar1 - iVar5 != 0 && iVar5 <= iVar1) {
          lVar15 = (long)iVar1 - (long)iVar5;
          pfVar10 = (float *)((long)iVar5 * vertex_stride + (long)vertices);
          fVar28 = -3.4028235e+38;
          iVar17 = iVar5;
          do {
            fVar27 = *pfVar10;
            if (fVar28 <= fVar27) {
              *(float **)(lVar21 + 0x10) = pfVar10;
              *(int *)(lVar21 + 0x18) = iVar17;
              fVar28 = fVar27;
            }
            iVar17 = iVar17 + 1;
            pfVar10 = (float *)((long)pfVar10 + vertex_stride);
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        *(int *)(lVar21 + 0x18) = *(int *)(lVar21 + 0x18) - iVar5;
        cVar4 = _al_list_is_empty(lVar18);
        if (cVar4 == '\0') {
          for (lVar15 = _al_list_front(lVar18); lVar15 != 0; lVar15 = _al_list_next(lVar18,lVar15))
          {
            lVar7 = _al_list_item_data(lVar15);
            if (**(float **)(lVar7 + 0x10) <= fVar28 && fVar28 != **(float **)(lVar7 + 0x10))
            goto LAB_0010dd98;
          }
        }
        lVar15 = 0;
LAB_0010dd98:
        if (lVar15 == 0) {
          _al_list_push_back(lVar18,lVar21);
        }
        else {
          _al_list_insert_before(lVar18,lVar15,lVar21);
        }
        uVar6 = uVar6 + 1;
        iVar5 = iVar1;
      } while (uVar16 != uVar6);
      goto LAB_0010ddea;
    }
    _al_list_destroy();
    al_free_with_context
              (lVar19,0x117,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/primitives/triangulator.c"
               ,"poly_create_split_list");
  }
  lVar18 = 0;
LAB_0010ddea:
  bVar22 = uVar16 < 2;
  bVar23 = vertices_00 != (_AL_LIST *)0x0;
  bVar24 = reflex != (_AL_LIST *)0x0;
  bVar25 = ear != (_AL_LIST *)0x0;
  bVar26 = lVar18 != 0;
  if (((bVar26 || bVar22) && bVar25) && (bVar24 && bVar23)) {
    lVar19 = (long)*__ptr;
    if (0 < lVar19) {
      do {
        _al_list_push_back(vertices_00);
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
    }
    p_Var13 = (_AL_LIST_ITEM *)_al_list_front(vertices_00);
    if (uVar16 < 2) {
      poly_classify_vertices_in_range(p_Var13,(_AL_LIST_ITEM *)0x0,vertices_00,reflex,ear);
    }
    else {
      poly_classify_vertices_in_range
                (p_Var13,(_AL_LIST_ITEM *)0x0,vertices_00,reflex,(_AL_LIST *)0x0);
      lVar19 = _al_list_front(lVar18);
      while (lVar19 != 0) {
        piVar8 = (int *)_al_list_item_data(lVar19);
        pfVar10 = *(float **)(piVar8 + 4);
        local_70 = *pfVar10 + 1.0;
        local_6c = pfVar10[1];
        p_Var14 = (_AL_LIST_ITEM *)_al_list_front(vertices_00);
        p_Var13 = (_AL_LIST_ITEM *)_al_list_next_circular(vertices_00);
        lVar19 = _al_list_size(vertices_00);
        if (lVar19 == 0) {
          local_68 = 0;
          uStack_60 = 0;
          local_d0 = (_AL_LIST_ITEM *)0x0;
          local_a0 = (_AL_LIST_ITEM *)0x0;
        }
        else {
          local_68 = 0;
          uStack_60 = 0;
          uVar16 = 0;
          local_a0 = (_AL_LIST_ITEM *)0x0;
          local_d0 = (_AL_LIST_ITEM *)0x0;
          fVar28 = 3.4028235e+38;
          do {
            p_Var20 = p_Var13;
            pfVar9 = (float *)_al_list_item_data(p_Var14);
            p1 = (float *)_al_list_item_data(p_Var20);
            if ((((p1[1] < pfVar9[1] || p1[1] == pfVar9[1]) &&
                 ((((*pfVar10 < *pfVar9 || (*pfVar10 < *p1)) &&
                   (_Var3 = _al_prim_intersect_segment
                                      (pfVar10,&local_70,pfVar9,p1,(float *)&local_38,&local_74,
                                       &local_78), _Var3)) &&
                  ((0.0 <= local_78 && (local_78 <= 1.0)))))) && (0.0 <= local_74)) &&
               (local_74 < fVar28)) {
              local_68 = local_38;
              uStack_60 = 0;
              local_d0 = p_Var14;
              local_a0 = p_Var20;
              fVar28 = local_74;
            }
            uVar16 = uVar16 + 1;
            p_Var13 = (_AL_LIST_ITEM *)_al_list_next_circular(vertices_00);
            uVar6 = _al_list_size(vertices_00);
            p_Var14 = p_Var20;
          } while (uVar16 < uVar6);
        }
        if (local_d0 == (_AL_LIST_ITEM *)0x0) {
          p_Var13 = (_AL_LIST_ITEM *)0x0;
        }
        else {
          local_40 = (float)local_68;
          uStack_3c = local_68._4_4_;
          pfVar9 = (float *)_al_list_item_data(local_d0);
          pfVar10 = (float *)_al_list_item_data(local_a0);
          _Var3 = _al_prim_are_points_equal(*(float **)(piVar8 + 4),pfVar9);
          p_Var13 = local_d0;
          if ((!_Var3) &&
             (_Var3 = _al_prim_are_points_equal(*(float **)(piVar8 + 4),pfVar10), p_Var13 = local_a0
             , !_Var3)) {
            if (*pfVar10 <= *pfVar9 && *pfVar9 != *pfVar10) {
              local_a0 = local_d0;
              pfVar10 = pfVar9;
            }
            lVar19 = _al_list_front(reflex);
            if (lVar19 == 0) {
              p_Var14 = (_AL_LIST_ITEM *)0x0;
            }
            else {
              p_Var14 = (_AL_LIST_ITEM *)0x0;
              fVar28 = 3.4028235e+38;
              do {
                p_Var13 = (_AL_LIST_ITEM *)_al_list_item_data(lVar19);
                pfVar9 = (float *)_al_list_item_data(p_Var13);
                _Var3 = _al_prim_is_point_in_triangle
                                  (pfVar9,*(float **)(piVar8 + 4),pfVar10,&local_40);
                if ((_Var3) &&
                   (fVar27 = *pfVar9 - **(float **)(piVar8 + 4),
                   fVar29 = pfVar9[1] - (*(float **)(piVar8 + 4))[1],
                   fVar27 = fVar27 * fVar27 + fVar29 * fVar29, fVar27 < fVar28)) {
                  p_Var14 = p_Var13;
                  fVar28 = fVar27;
                }
                lVar19 = _al_list_next(reflex);
              } while (lVar19 != 0);
            }
            p_Var13 = local_a0;
            if (p_Var14 != (_AL_LIST_ITEM *)0x0) {
              p_Var13 = p_Var14;
            }
          }
        }
        if (p_Var13 == (_AL_LIST_ITEM *)0x0) break;
        uVar16 = *(ulong *)(piVar8 + 2);
        uVar6 = 0;
        p_Var14 = p_Var13;
        do {
          p_Var14 = (_AL_LIST_ITEM *)
                    _al_list_insert_after
                              (vertices_00,p_Var14,
                               (float *)((((long)piVar8[6] + uVar6) % uVar16 + (long)*piVar8) *
                                         vertex_stride + (long)vertices));
          uVar6 = uVar6 + 1;
          uVar16 = *(ulong *)(piVar8 + 2);
        } while (uVar6 <= uVar16);
        uVar11 = _al_list_item_data(p_Var13);
        uVar11 = _al_list_insert_after(vertices_00,p_Var14,uVar11);
        _al_list_remove(reflex,p_Var13);
        p_Var14 = (_AL_LIST_ITEM *)_al_list_next(vertices_00,uVar11);
        poly_classify_vertices_in_range(p_Var13,p_Var14,vertices_00,reflex,(_AL_LIST *)0x0);
        lVar19 = _al_list_next(lVar18);
      }
      _al_list_destroy(lVar18);
      p_Var13 = (_AL_LIST_ITEM *)_al_list_front(vertices_00);
      poly_classify_vertices_in_range(p_Var13,(_AL_LIST_ITEM *)0x0,vertices_00,(_AL_LIST *)0x0,ear);
    }
  }
  else {
    _al_list_destroy(vertices_00);
    _al_list_destroy(reflex);
    _al_list_destroy(ear);
    _al_list_destroy(lVar18);
    vertices_00 = (_AL_LIST *)0x0;
    reflex = (_AL_LIST *)0x0;
    ear = (_AL_LIST *)0x0;
  }
  if (((bVar26 || bVar22) && bVar25) && (bVar24 && bVar23)) {
    cVar4 = _al_list_is_empty(ear);
    pvVar2 = local_50;
    while (cVar4 == '\0') {
      uVar11 = _al_list_front(ear);
      uVar12 = _al_list_item_data(uVar11);
      p_Var13 = (_AL_LIST_ITEM *)_al_list_previous_circular(vertices_00,uVar12);
      p_Var14 = (_AL_LIST_ITEM *)_al_list_next_circular(vertices_00,uVar12);
      lVar18 = _al_list_item_data(p_Var13);
      lVar19 = _al_list_item_data(uVar12);
      lVar21 = _al_list_item_data(p_Var14);
      (*local_48)((int)((ulong)(lVar18 - (long)vertices) / vertex_stride),
                  (int)((ulong)(lVar19 - (long)vertices) / vertex_stride),
                  (int)((ulong)(lVar21 - (long)vertices) / vertex_stride),pvVar2);
      _al_list_erase(ear,uVar11);
      _al_list_erase(vertices_00,uVar12);
      uVar11 = _al_list_find_first(reflex,uVar12);
      _al_list_erase(reflex,uVar11);
      poly_update_vertex_attributes(vertices_00,reflex,ear,p_Var13);
      poly_update_vertex_attributes(vertices_00,reflex,ear,p_Var14);
      cVar4 = _al_list_is_empty(ear);
    }
    _al_list_destroy(vertices_00);
    _al_list_destroy(reflex);
    _al_list_destroy(ear);
  }
  free(__ptr);
  return ((bVar26 || bVar22) && bVar25) && (bVar24 && bVar23);
}

Assistant:

bool al_triangulate_polygon(
   const float* vertices, size_t vertex_stride, const int* vertex_counts,
   void (*emit_triangle)(int, int, int, void*), void* userdata)
{
   POLY polygon;
   int vertex_count;
   int split_count;
   int *splits;
   int i;
   bool ret;

   for (i = 0; vertex_counts[i] > 0; i++) {
      /* do nothing */
   }
   ASSERT(i > 0);
   split_count = i;

   splits = malloc(split_count * sizeof(int));
   if (!splits) {
      return false;
   }
   vertex_count = 0;
   for (i = 0; i < split_count; i++) {
      vertex_count += vertex_counts[i];
      splits[i] = vertex_count;
   }

   memset(&polygon, 0, sizeof(polygon));
   polygon.vertex_buffer = vertices;
   polygon.vertex_stride = vertex_stride;
   polygon.vertex_count  = vertex_count;
   polygon.split_indices = splits;
   polygon.split_stride  = sizeof(int);   /* XXX can simplify code now */
   polygon.split_count   = split_count;
   polygon.emit          = emit_triangle;
   polygon.userdata      = userdata;

   if (poly_initialize(&polygon)) {

      poly_do_triangulate(&polygon);

      _al_list_destroy(polygon.vertex_list);
      _al_list_destroy(polygon.reflex_list);
      _al_list_destroy(polygon.ear_list);

      ret = true;
   }
   else {
      ret = false;
   }

   free(splits);

   return ret;
}